

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

ElementTypeAndOffset * __thiscall
choc::value::Type::Object::getElementInfo
          (ElementTypeAndOffset *__return_storage_ptr__,Object *this,uint32_t index)

{
  MemberNameAndType *pMVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  
  lVar5 = 0x10;
  uVar3 = 0;
  sVar4 = 0;
  while( true ) {
    if ((this->members).size <= uVar3) {
      throwError("Index out of range");
    }
    pMVar1 = (this->members).items;
    if (index == uVar3) break;
    sVar2 = Type::getValueDataSize((Type *)((long)&(pMVar1->name)._M_len + lVar5));
    sVar4 = sVar4 + sVar2;
    uVar3 = uVar3 + 1;
    lVar5 = lVar5 + 0x30;
  }
  Type(&__return_storage_ptr__->elementType,&pMVar1[index].type);
  __return_storage_ptr__->offset = sVar4;
  return __return_storage_ptr__;
}

Assistant:

ElementTypeAndOffset getElementInfo (uint32_t index) const
    {
        size_t offset = 0;

        for (uint32_t i = 0; i < members.size; ++i)
        {
            if (i == index)
                return { members[i].type, offset };

            offset += members[i].type.getValueDataSize();
        }

        throwError ("Index out of range");
    }